

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

ostream * operator<<(ostream *out,skiplist<DictKey,_std::less<DictKey>_> *sl)

{
  bool bVar1;
  reference ppSVar2;
  mapped_type *pmVar3;
  reference ppSVar4;
  ostream *poVar5;
  reverse_iterator<__gnu_cxx::__normal_iterator<SLNode<DictKey>_*const_*,_std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>_>_>
  local_b0;
  int local_a8;
  int local_a4;
  int i_1;
  int local_9c;
  SLNode<DictKey> *pSStack_98;
  int i;
  SLNode<DictKey> *it;
  int next_index;
  int index;
  const_reverse_iterator end;
  const_reverse_iterator level;
  int local_64;
  const_iterator cStack_60;
  int cur_index;
  SLNode<DictKey> *local_58;
  SLNode<DictKey> *bottom_it;
  map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_> index_store
  ;
  skiplist<DictKey,_std::less<DictKey>_> *sl_local;
  ostream *out_local;
  
  index_store._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)sl;
  bVar1 = std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>::empty(&sl->key);
  if (bVar1) {
    poVar5 = std::operator<<(out,"EMPTY SKIPLIST");
    out_local = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    memset(&bottom_it,0,0x30);
    std::map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>::map
              ((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                *)&bottom_it);
    cStack_60 = std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>::begin
                          ((vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_> *)
                           index_store._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ppSVar2 = __gnu_cxx::
              __normal_iterator<SLNode<DictKey>_*const_*,_std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>_>
              ::operator*(&stack0xffffffffffffffa0);
    local_58 = (*ppSVar2)->next;
    local_64 = 0;
    for (; local_58 != (SLNode<DictKey> *)0x0; local_58 = local_58->next) {
      pmVar3 = std::
               map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
               ::operator[]((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                             *)&bottom_it,&local_58->val);
      *pmVar3 = local_64;
      local_64 = local_64 + 1;
    }
    std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>::rbegin
              ((vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_> *)&end);
    std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>::rend
              ((vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_> *)&next_index);
    while( true ) {
      bVar1 = std::operator!=(&end,(reverse_iterator<__gnu_cxx::__normal_iterator<SLNode<DictKey>_*const_*,_std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>_>_>
                                    *)&next_index);
      if (!bVar1) break;
      std::operator<<(out,"S");
      it._4_4_ = -1;
      ppSVar4 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<SLNode<DictKey>_*const_*,_std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>_>_>
                ::operator*(&end);
      for (pSStack_98 = (*ppSVar4)->next; pSStack_98 != (SLNode<DictKey> *)0x0;
          pSStack_98 = pSStack_98->next) {
        pmVar3 = std::
                 map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                 ::operator[]((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                               *)&bottom_it,&pSStack_98->val);
        it._0_4_ = *pmVar3;
        for (local_9c = 1; local_9c < (mapped_type)it - it._4_4_; local_9c = local_9c + 1) {
          std::operator<<(out,"----");
        }
        poVar5 = std::operator<<(out,"-");
        i_1._3_1_ = std::setfill<char>('-');
        poVar5 = std::operator<<(poVar5,i_1._3_1_);
        local_a4 = (int)std::setw(3);
        poVar5 = std::operator<<(poVar5,(_Setw)local_a4);
        operator<<(poVar5,&pSStack_98->val);
        it._4_4_ = (mapped_type)it;
      }
      it._0_4_ = local_64;
      for (local_a8 = 1; local_a8 < (mapped_type)it - it._4_4_; local_a8 = local_a8 + 1) {
        std::operator<<(out,"----");
      }
      std::operator<<(out,"-E");
      std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<SLNode<DictKey>_*const_*,_std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>_>_>
      ::operator++(&local_b0,(int)&end);
    }
    std::map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>::
    ~map((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_> *)
         &bottom_it);
    out_local = out;
  }
  return out_local;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const skiplist<T, X>& sl) {
    if (sl.key.empty()) {
        return out << "EMPTY SKIPLIST" << std::endl;
    }

    // store mapping of node->index in a map
    std::map<T, int> index_store{};
    auto bottom_it = (*(sl.key.begin()))->next;
    int cur_index = 0;
    while (bottom_it) {
        index_store[bottom_it->val] = cur_index;
        cur_index++;
        bottom_it = bottom_it->next;
    }

    auto level = sl.key.rbegin();
    auto end = sl.key.rend();
    while(level != end) {
        // S denotes start of level, could be something different
        out << "S";

        // to store previous element's index
        // and current element's index
        int index = -1, next_index;
        // skip the first element - it is always 0
        auto it = (*level)->next;
        // iterate through the list at this level
        while (it) {
            next_index = index_store[it->val];

            // filler to align it correctly
            // when elements in between don't exist at this level
            for (int i = 1; i < next_index - index; ++i) {
                out << "----";
            }

            // width of printed element is hardcoded to 3 for now
            // the padding is filled with ""-"
            out << "-" << std::setfill('-') << std::setw(3) << it->val;
            it = it->next;

            index = next_index;
        }
        next_index = cur_index;

        for (int i = 1; i < next_index - index; ++i) {
            out << "----";
        }

        out << "-E";

        out << std::endl;

        level++;
    }

    return out;
}